

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yoml-parser.h
# Opt level: O0

yoml_t * yoml__parse_node(yaml_parser_t *parser,yaml_event_type_t *unhandled,
                         yoml_parse_args_t *parse_args)

{
  _func_void_ptr_void_ptr_int_size_t *p_Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  undefined1 local_98 [8];
  yaml_event_t event;
  yoml_t *node;
  yoml_parse_args_t *parse_args_local;
  yaml_event_type_t *unhandled_local;
  yaml_parser_t *parser_local;
  
  if (unhandled != (yaml_event_type_t *)0x0) {
    *unhandled = YAML_NO_EVENT;
  }
  while( true ) {
    iVar2 = yaml_parser_parse(parser,(yaml_event_t *)local_98);
    if (iVar2 == 0) {
      return (yoml_t *)0x0;
    }
    if ((local_98._0_4_ != YAML_STREAM_START_EVENT) && (local_98._0_4_ != YAML_DOCUMENT_START_EVENT)
       ) break;
    yaml_event_delete((yaml_event_t *)local_98);
  }
  switch(local_98._0_4_) {
  case 5:
    event.end_mark.column =
         (size_t)yoml__new_node(parse_args->filename,YOML__TYPE_UNRESOLVED_ALIAS,0x50,
                                (yaml_char_t *)0x0,(yaml_char_t *)0x0,(yaml_event_t *)local_98);
    pcVar3 = yoml__strdup((yaml_char_t *)event._0_8_);
    *(char **)(event.end_mark.column + 0x38) = pcVar3;
    break;
  case 6:
    event.end_mark.column =
         (size_t)yoml__new_node(parse_args->filename,YOML_TYPE_SCALAR,0x50,
                                (yaml_char_t *)event._0_8_,event.data.scalar.anchor,
                                (yaml_event_t *)local_98);
    pcVar3 = yoml__strdup(event.data.scalar.tag);
    *(char **)(event.end_mark.column + 0x38) = pcVar3;
    if (parse_args->mem_set != (_func_void_ptr_void_ptr_int_size_t *)0x0) {
      p_Var1 = parse_args->mem_set;
      sVar4 = strlen(*(char **)(event.end_mark.column + 0x38));
      (*p_Var1)(event.data.document_start.tag_directives.start,0x41,sVar4);
    }
    break;
  case 7:
    event.end_mark.column = (size_t)yoml__parse_sequence(parser,(yaml_event_t *)local_98,parse_args)
    ;
    break;
  default:
    event.end_mark.column = 0;
    if (unhandled != (yaml_event_type_t *)0x0) {
      *unhandled = local_98._0_4_;
    }
    break;
  case 9:
    event.end_mark.column = (size_t)yoml__parse_mapping(parser,(yaml_event_t *)local_98,parse_args);
  }
  yaml_event_delete((yaml_event_t *)local_98);
  return (yoml_t *)event.end_mark.column;
}

Assistant:

static yoml_t *yoml__parse_node(yaml_parser_t *parser, yaml_event_type_t *unhandled, yoml_parse_args_t *parse_args)
{
    yoml_t *node;
    yaml_event_t event;

    if (unhandled != NULL)
        *unhandled = YAML_NO_EVENT;

    /* wait for a node that is not a stream/doc start event */
    while (1) {
        if (!yaml_parser_parse(parser, &event))
            return NULL;
        if (!(event.type == YAML_STREAM_START_EVENT || event.type == YAML_DOCUMENT_START_EVENT))
            break;
        yaml_event_delete(&event);
    }

    switch (event.type) {
    case YAML_ALIAS_EVENT:
        node = yoml__new_node(parse_args->filename, YOML__TYPE_UNRESOLVED_ALIAS, sizeof(*node), NULL, NULL, &event);
        node->data.alias = yoml__strdup(event.data.alias.anchor);
        break;
    case YAML_SCALAR_EVENT:
        node = yoml__new_node(parse_args->filename, YOML_TYPE_SCALAR, sizeof(*node), event.data.scalar.anchor, event.data.scalar.tag, &event);
        node->data.scalar = yoml__strdup(event.data.scalar.value);
        if (parse_args->mem_set != NULL)
            parse_args->mem_set(event.data.scalar.value, 'A', strlen(node->data.scalar));
        break;
    case YAML_SEQUENCE_START_EVENT:
        node = yoml__parse_sequence(parser, &event, parse_args);
        break;
    case YAML_MAPPING_START_EVENT:
        node = yoml__parse_mapping(parser, &event, parse_args);
        break;
    default:
        node = NULL;
        if (unhandled != NULL)
            *unhandled = event.type;
        break;
    }

    yaml_event_delete(&event);

    return node;
}